

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

bool __thiscall spirv_cross::CompilerGLSL::should_dereference(CompilerGLSL *this,uint32_t id)

{
  bool bVar1;
  undefined8 in_RAX;
  SPIRType *pSVar2;
  SPIRVariable *pSVar3;
  SPIRExpression *pSVar4;
  const_iterator cVar5;
  SPIRType *pSVar6;
  ulong uVar7;
  Variant *pVVar8;
  undefined8 uStack_38;
  
  uVar7 = (ulong)id;
  uStack_38 = in_RAX;
  pSVar2 = Compiler::expression_type(&this->super_Compiler,id);
  if ((pSVar2->pointer != true) ||
     (bVar1 = Compiler::expression_is_lvalue(&this->super_Compiler,id), !bVar1)) {
    return false;
  }
  if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar7) {
    return true;
  }
  pVVar8 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar8[uVar7].type != TypeVariable) {
    pVVar8 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
    if (pVVar8[uVar7].type != TypeExpression) {
      return true;
    }
    pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar8 + uVar7);
    if (pSVar4->access_chain != false) {
      return false;
    }
    if ((pSVar4->loaded_from).id == 0) {
      return true;
    }
    while( true ) {
      uStack_38 = CONCAT44((pSVar4->super_IVariant).self.id,(undefined4)uStack_38);
      cVar5 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->super_Compiler).forwarded_temporaries._M_h,
                     (key_type *)((long)&uStack_38 + 4));
      if (cVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        return true;
      }
      pSVar6 = Compiler::expression_type(&this->super_Compiler,(pSVar4->loaded_from).id);
      if (pSVar6->pointer != pSVar2->pointer) {
        return true;
      }
      if (pSVar6->pointer_depth != pSVar2->pointer_depth) {
        return true;
      }
      if ((pSVar6->parent_type).id != (pSVar2->parent_type).id) {
        return true;
      }
      uVar7 = (ulong)(pSVar4->loaded_from).id;
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar7)
      {
        return true;
      }
      pVVar8 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar8[uVar7].type == TypeVariable) break;
      pVVar8 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar8[uVar7].type != TypeExpression) {
        return true;
      }
      pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar8 + uVar7);
      if ((pSVar4->loaded_from).id == 0) {
        return true;
      }
    }
  }
  pSVar3 = Variant::get<spirv_cross::SPIRVariable>(pVVar8 + uVar7);
  return pSVar3->phi_variable;
}

Assistant:

bool CompilerGLSL::should_dereference(uint32_t id)
{
	const auto &type = expression_type(id);
	// Non-pointer expressions don't need to be dereferenced.
	if (!type.pointer)
		return false;

	// Handles shouldn't be dereferenced either.
	if (!expression_is_lvalue(id))
		return false;

	// If id is a variable but not a phi variable, we should not dereference it.
	if (auto *var = maybe_get<SPIRVariable>(id))
		return var->phi_variable;

	if (auto *expr = maybe_get<SPIRExpression>(id))
	{
		// If id is an access chain, we should not dereference it.
		if (expr->access_chain)
			return false;

		// If id is a forwarded copy of a variable pointer, we should not dereference it.
		SPIRVariable *var = nullptr;
		while (expr->loaded_from && expression_is_forwarded(expr->self))
		{
			auto &src_type = expression_type(expr->loaded_from);
			// To be a copy, the pointer and its source expression must be the
			// same type. Can't check type.self, because for some reason that's
			// usually the base type with pointers stripped off. This check is
			// complex enough that I've hoisted it out of the while condition.
			if (src_type.pointer != type.pointer || src_type.pointer_depth != type.pointer_depth ||
			    src_type.parent_type != type.parent_type)
				break;
			if ((var = maybe_get<SPIRVariable>(expr->loaded_from)))
				break;
			if (!(expr = maybe_get<SPIRExpression>(expr->loaded_from)))
				break;
		}

		return !var || var->phi_variable;
	}

	// Otherwise, we should dereference this pointer expression.
	return true;
}